

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall QGraphicsScene::destroyItemGroup(QGraphicsScene *this,QGraphicsItemGroup *group)

{
  QGraphicsItem **ppQVar1;
  QList<QGraphicsItem_*> *__range1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QList<QGraphicsItem_*> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  QGraphicsItem::childItems(&local_48,&group->super_QGraphicsItem);
  ppQVar1 = local_48.d.ptr;
  if ((undefined1 *)local_48.d.size != (undefined1 *)0x0) {
    lVar3 = local_48.d.size << 3;
    lVar2 = 0;
    do {
      QGraphicsItemGroup::removeFromGroup(group,*(QGraphicsItem **)((long)ppQVar1 + lVar2));
      lVar2 = lVar2 + 8;
    } while (lVar3 != lVar2);
  }
  removeItem(this,&group->super_QGraphicsItem);
  (*(group->super_QGraphicsItem)._vptr_QGraphicsItem[1])(group);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScene::destroyItemGroup(QGraphicsItemGroup *group)
{
    const auto items = group->childItems();
    for (QGraphicsItem *item : items)
        group->removeFromGroup(item);
    removeItem(group);
    delete group;
}